

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSidAddress.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::SidAddress::~SidAddress(SidAddress *this)

{
  this->_vptr_SidAddress = (_func_int **)&PTR__SidAddress_00954020;
  std::__cxx11::string::~string((string *)&this->mMemberSelectionName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->mSids);
  std::__cxx11::string::~string((string *)&this->mId);
  return;
}

Assistant:

SidAddress::~SidAddress()
	{
	}